

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

vector<calc::Token,_std::allocator<calc::Token>_> *
calc::tokenize(vector<calc::Token,_std::allocator<calc::Token>_> *__return_storage_ptr__,string *str
              )

{
  byte first;
  int iVar1;
  istream *piVar2;
  logic_error *this;
  bool bVar3;
  int iVar4;
  char c;
  string wrongExpr;
  string error;
  istringstream iss;
  byte local_219;
  Token local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<calc::Token,_std::allocator<calc::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)str,_S_in);
  bVar3 = true;
LAB_0010742a:
  do {
    piVar2 = std::operator>>((istream *)local_1b0,(char *)&local_219);
    first = local_219;
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    iVar4 = (int)(char)local_219;
    iVar1 = isspace(iVar4);
  } while (iVar1 != 0);
  switch(first) {
  case 0x28:
    local_218.value._M_dataplus._M_p = (pointer)&local_218.value.field_2;
    local_218.value.field_2._M_local_buf[0] = 0x28;
    local_218.value.field_2._M_local_buf[1] = '\0';
    local_218.value._M_string_length = 1;
    local_218.type = LEFT_BRACKET;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,&local_218);
    break;
  case 0x29:
    local_218.value._M_dataplus._M_p = (pointer)&local_218.value.field_2;
    local_218.value.field_2._M_local_buf[0] = 0x29;
    local_218.value.field_2._M_local_buf[1] = '\0';
    local_218.value._M_string_length = 1;
    local_218.type = RIGHT_BRACKET;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,&local_218);
LAB_00107579:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.value._M_dataplus._M_p != &local_218.value.field_2) {
      operator_delete(local_218.value._M_dataplus._M_p,
                      CONCAT62(local_218.value.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_218.value.field_2._M_local_buf[1],
                                        local_218.value.field_2._M_local_buf[0])) + 1);
    }
    bVar3 = false;
    goto LAB_0010742a;
  default:
    if (iVar4 - 0x30U < 10) {
      anon_unknown.dwarf_1c6aa::tokenizeNumber(&local_218,(istream *)local_1b0,first);
      std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
                (__return_storage_ptr__,&local_218);
      goto LAB_00107579;
    }
    if ((first != 0x2f) && (first != 0x2a)) {
      local_218.value._M_dataplus._M_p = (pointer)&local_218.value.field_2;
      local_218.value._M_string_length = 0;
      local_218.value.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)local_1b0,(string *)&local_218);
      std::__cxx11::string::_M_replace_aux((ulong)&local_218,0,0,'\x01');
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Incorrect input: ","");
      std::operator+(&local_1d0,&local_1f0,&local_218.value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,local_1d0._M_dataplus._M_p);
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    local_218.value._M_dataplus._M_p = (pointer)&local_218.value.field_2;
    local_218.value.field_2._M_local_buf[0] = first;
    local_218.value._M_string_length = 1;
    local_218.value.field_2._M_local_buf[1] = '\0';
    local_218.type = OPERATION;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,&local_218);
    break;
  case 0x2b:
  case 0x2d:
    if (bVar3) {
      anon_unknown.dwarf_1c6aa::tokenizeNumber(&local_218,(istream *)local_1b0,first);
      std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
                (__return_storage_ptr__,&local_218);
      goto LAB_00107579;
    }
    local_218.value._M_dataplus._M_p = (pointer)&local_218.value.field_2;
    local_218.value.field_2._M_local_buf[0] = first;
    local_218.value._M_string_length = 1;
    local_218.value.field_2._M_local_buf[1] = '\0';
    local_218.type = OPERATION;
    std::vector<calc::Token,_std::allocator<calc::Token>_>::emplace_back<calc::Token>
              (__return_storage_ptr__,&local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.value._M_dataplus._M_p != &local_218.value.field_2) {
    operator_delete(local_218.value._M_dataplus._M_p,
                    CONCAT62(local_218.value.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_218.value.field_2._M_local_buf[1],
                                      local_218.value.field_2._M_local_buf[0])) + 1);
  }
  bVar3 = true;
  goto LAB_0010742a;
}

Assistant:

vector<Token> calc::tokenize(string str)
{
	vector<Token> result;

	istringstream iss(move(str));
	bool unary = true;
	char c;
	while (iss >> c)
	{
		if (isspace(c))
		{
			continue;
		}
		else if (c == '(')
		{
			result.push_back({ {c}, TokenType::LEFT_BRACKET });
			unary = true;
		}
		else if (c == ')')
		{
			result.push_back({ {c}, TokenType::RIGHT_BRACKET });
			unary = false;
		}
		else if (c == '-' || c == '+')
		{
			if (unary)
			{
				result.push_back(tokenizeNumber(iss, c));
				unary = false;
			}
			else
			{
				result.push_back({ {c}, TokenType::OPERATION });
				unary = true;
			}
		}
		else if (isdigit(c))
		{
			result.push_back(tokenizeNumber(iss, c));
			unary = false;
		}
		else if (c == '/' || c == '*')
		{
			result.push_back({ {c}, TokenType::OPERATION });
			unary = true;
		}
		else
		{
			string wrongExpr;
			iss >> wrongExpr;
			wrongExpr.insert(begin(wrongExpr), c);
			string error = string("Incorrect input: ") + wrongExpr;
			throw logic_error(error.c_str());
		}
	}

	return result;
}